

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

char * FindFileContentInImportPaths
                 (InplaceStr moduleName,char *moduleRoot,bool addExtension,char *resultPathBuf,
                 uint resultPathBufSize,uint *fileSize)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *local_90;
  uint local_64;
  uint e;
  uint i;
  char *pathNoImport;
  char *pathEnd;
  char *modulePath;
  char *pcStack_40;
  uint modulePathPos;
  char *fileContent;
  uint resultPathBufSize_local;
  char *resultPathBuf_local;
  bool addExtension_local;
  char *moduleRoot_local;
  InplaceStr moduleName_local;
  
  moduleName_local.begin = moduleName.end;
  moduleRoot_local = moduleName.begin;
  pcStack_40 = (char *)0x0;
  modulePath._4_4_ = 0;
  do {
    pcVar3 = BinaryCache::EnumImportPath(modulePath._4_4_);
    if (pcVar3 == (char *)0x0) {
      return pcStack_40;
    }
    local_90 = moduleRoot;
    if (moduleRoot == (char *)0x0) {
      local_90 = "";
    }
    pcVar4 = "";
    if (moduleRoot != (char *)0x0) {
      pcVar4 = "/";
    }
    uVar1 = InplaceStr::length((InplaceStr *)&moduleRoot_local);
    iVar2 = NULLC::SafeSprintf(resultPathBuf,(ulong)resultPathBufSize,"%s%s%s%.*s",pcVar3,local_90,
                               pcVar4,uVar1,moduleRoot_local);
    if (addExtension) {
      sVar5 = strlen(pcVar3);
      pcVar3 = resultPathBuf + sVar5;
      local_64 = 0;
      sVar5 = strlen(pcVar3);
      for (; local_64 != (uint)sVar5; local_64 = local_64 + 1) {
        if (pcVar3[local_64] == '.') {
          pcVar3[local_64] = '/';
        }
      }
      NULLC::SafeSprintf(resultPathBuf + iVar2,
                         (ulong)(resultPathBufSize -
                                ((int)(resultPathBuf + iVar2) - (int)resultPathBuf)),".nc");
    }
    pcStack_40 = (char *)(*(code *)NULLC::fileLoad)(resultPathBuf,fileSize);
    modulePath._4_4_ = modulePath._4_4_ + 1;
  } while (pcStack_40 == (char *)0x0);
  return pcStack_40;
}

Assistant:

const char* FindFileContentInImportPaths(InplaceStr moduleName, const char *moduleRoot, bool addExtension, char *resultPathBuf, unsigned resultPathBufSize, unsigned &fileSize)
{
	const char *fileContent = NULL;

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = resultPathBuf + NULLC::SafeSprintf(resultPathBuf, resultPathBufSize, "%s%s%s%.*s", modulePath, moduleRoot ? moduleRoot : "", moduleRoot ? "/" : "", moduleName.length(), moduleName.begin);

		if(addExtension)
		{
			char *pathNoImport = resultPathBuf + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, resultPathBufSize - int(pathEnd - resultPathBuf), ".nc");
		}

		fileContent = NULLC::fileLoad(resultPathBuf, &fileSize);

		if(fileContent)
			break;
	}

	return fileContent;
}